

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

size_t __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOffsets
          (MessageGenerator *this,Printer *p)

{
  Options *opts;
  int iVar1;
  Descriptor *pDVar2;
  ushort *puVar3;
  int32_t *piVar4;
  pointer *ppSVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  value_type_conflict field;
  value_type pOVar9;
  pointer piVar10;
  Nonnull<char_*> pcVar11;
  Nonnull<const_char_*> failure_msg;
  undefined1 split;
  Options *in_RCX;
  OneofDescriptor *pOVar12;
  AlphaNum *b;
  int iVar13;
  FieldDescriptor *field_00;
  long v1;
  size_t sVar14;
  char *pcVar15;
  AlphaNum *pAVar16;
  uint uVar17;
  int32_t *piVar18;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Hex hex;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string index_1;
  Formatter format;
  Iterator __begin3_1;
  size_t offsets;
  Iterator __end3_1;
  Iterator __begin3;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Iterator __end3;
  byte local_26a;
  size_t local_260;
  undefined1 local_258 [40];
  undefined1 local_230 [16];
  size_t sStack_220;
  HeapOrSoo local_218;
  int local_204;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_200 [2];
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  local_1d0;
  undefined1 local_1b0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  char *local_160;
  Iterator local_158;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_148;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_130;
  Iterator local_118;
  Options local_108;
  
  pDVar2 = this->descriptor_;
  opts = &this->options_;
  Options::Options(&local_108,opts);
  cpp::anon_unknown_0::ClassVars(local_200,(anon_unknown_0 *)pDVar2,(Descriptor *)&local_108,in_RCX)
  ;
  vars.len_ = ((long)local_200[0].
                     super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_200[0].
                     super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x2c8590b21642c859;
  vars.ptr_ = local_200[0].
              super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              ._M_impl.super__Vector_impl_data._M_start;
  io::Printer::WithDefs(&local_130,p,vars,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(local_200);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&local_108.field_listener_options.forbidden_field_listener_events.
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.annotation_guard_name._M_dataplus._M_p !=
      &local_108.annotation_guard_name.field_2) {
    operator_delete(local_108.annotation_guard_name._M_dataplus._M_p,
                    local_108.annotation_guard_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.annotation_pragma_name._M_dataplus._M_p !=
      &local_108.annotation_pragma_name.field_2) {
    operator_delete(local_108.annotation_pragma_name._M_dataplus._M_p,
                    local_108.annotation_pragma_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.runtime_include_base._M_dataplus._M_p != &local_108.runtime_include_base.field_2)
  {
    operator_delete(local_108.runtime_include_base._M_dataplus._M_p,
                    local_108.runtime_include_base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.dllexport_decl._M_dataplus._M_p != &local_108.dllexport_decl.field_2) {
    operator_delete(local_108.dllexport_decl._M_dataplus._M_p,
                    local_108.dllexport_decl.field_2._M_allocated_capacity + 1);
  }
  MakeTrackerCalls(local_200,this->descriptor_,opts);
  vars_00.len_ = ((long)local_200[0].
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_200[0].
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x2c8590b21642c859;
  vars_00.ptr_ = local_200[0].
                 super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  io::Printer::WithDefs(&local_148,p,vars_00,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(local_200);
  local_230._8_8_ = 0;
  sStack_220 = 0;
  local_218.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  local_26a = 1;
  if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_26a = (this->descriptor_->options_->field_0)._impl_.map_entry_;
  }
  pDVar2 = this->descriptor_;
  local_1d0._8_8_ =
       (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  iVar13 = pDVar2->real_oneof_decl_count_;
  iVar1 = pDVar2->extension_range_count_;
  local_204 = this->num_weak_fields_;
  local_1d0._0_8_ =
       (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_230._0_8_ = p;
  bVar7 = ShouldSplit(pDVar2,opts);
  bVar8 = 0 < local_204;
  uVar17 = (uint)(local_1d0._8_8_ != local_1d0._0_8_);
  local_1d0._28_4_ = ZEXT14(local_26a);
  hex._8_4_ = uVar17 << 4;
  local_200[0].
  super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  local_200[0].
  super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x57d4f9;
  local_258._0_8_ = local_258 + 0x10;
  local_258._24_8_ = 0;
  local_258._8_8_ = (AlphaNum *)0x0;
  local_258._16_8_ = 0;
  hex.value = 0x3003;
  hex._12_4_ = 0;
  absl::lts_20250127::AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
            ((lts_20250127 *)local_258,
             (StringifySink *)
             (ulong)(uVar17 << 8 | (uint)bVar7 << 6 | (uint)bVar7 << 5 | (uint)local_26a |
                    (uint)local_26a * 0x80 + (uint)(0 < iVar1) * 2 + (uint)(0 < iVar13) * 4 +
                    (uint)bVar8 * 8 | hex._8_4_),hex);
  local_190._0_8_ = local_258._8_8_;
  local_190._8_8_ = local_258._0_8_;
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_1b0,(lts_20250127 *)local_200,(AlphaNum *)local_190,
             (AlphaNum *)local_258._8_8_);
  if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
  }
  Formatter::operator()
            ((Formatter *)local_230,"$1$, // bitmap\n",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
  if ((pointer)local_1b0._0_8_ != (pointer)(local_1b0 + 0x10)) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if (local_26a != 0) {
    format_00._M_str = "PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n";
    format_00._M_len = 0x30;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_230._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_230 + 8),format_00);
  }
  if (0 < iVar1) {
    format_01._M_str = "PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n";
    format_01._M_len = 0x32;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_230._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_230 + 8),format_01);
  }
  if (0 < iVar13) {
    format_02._M_str = "PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n";
    format_02._M_len = 0x35;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_230._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_230 + 8),format_02);
  }
  if (0 < local_204) {
    format_03._M_str = "PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n";
    format_03._M_len = 0x36;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_230._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_230 + 8),format_03);
  }
  if (local_1d0._8_8_ != local_1d0._0_8_) {
    format_04._M_str = "PROTOBUF_FIELD_OFFSET($classtype$, $inlined_string_donated_array$),\n";
    format_04._M_len = 0x44;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_230._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_230 + 8),format_04);
  }
  if (bVar7) {
    format_05._M_str =
         "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\nsizeof($classtype$::Impl_::Split),\n";
    format_05._M_len = 0x50;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_230._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_230 + 8),format_05);
  }
  local_1d0._16_8_ =
       SEXT48((int)((uint)bVar8 + (uint)bVar7 * 2 + (uint)(0 < iVar1) + (uint)(0 < iVar13) +
                    this->descriptor_->field_count_ + this->descriptor_->real_oneof_decl_count_ +
                    (uVar17 + local_1d0._28_4_) * 2 + 1));
  if (local_26a != 0) {
    Formatter::operator()
              ((Formatter *)local_230,"$1$, // hasbit index offset\n",
               (unsigned_long *)(local_1d0._M_first._M_storage._M_storage + 0x10));
  }
  if (local_1d0._8_8_ != local_1d0._0_8_) {
    local_200[0].
    super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(((long)(this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2) + local_1d0._16_8_);
    Formatter::operator()
              ((Formatter *)local_230,"$1$, // inline string index offset\n",
               (unsigned_long *)local_200);
  }
  uVar6 = local_1d0._16_8_;
  local_260 = local_1d0._16_8_;
  local_158.descriptor = this->descriptor_;
  local_158.idx = 0;
  local_118.idx = (local_158.descriptor)->field_count_;
  local_118.descriptor = local_158.descriptor;
  do {
    bVar8 = protobuf::internal::operator==(&local_158,&local_118);
    if (bVar8) {
      local_200[0].
      super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)this->descriptor_;
      local_200[0].
      super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_200[0].
                            super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      local_190._0_4_ =
           *(int *)((long)&((local_200[0].
                             super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->annotation_).
                           super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                   + 0x14);
      v1 = 0;
      local_190._8_8_ =
           local_200[0].
           super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        bVar8 = cpp::operator==((Iterator *)local_200,(Iterator *)local_190);
        if (bVar8) break;
        pOVar9 = OneOfRangeImpl::Iterator::operator*((Iterator *)local_200);
        puVar3 = (ushort *)(pOVar9->all_names_).payload_;
        local_258._0_8_ = ZEXT28(*puVar3);
        local_258._8_8_ = (long)puVar3 + ~local_258._0_8_;
        Formatter::operator()
                  ((Formatter *)local_230,"PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n",
                   (basic_string_view<char,_std::char_traits<char>_> *)local_258);
        local_200[0].
        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_200[0].
                               super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (int)local_200[0].
                                    super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
        v1 = v1 + 1;
      }
      iVar13 = this->descriptor_->real_oneof_decl_count_;
      if (iVar13 == (int)v1) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (v1,(long)iVar13,"count == descriptor_->real_oneof_decl_count()");
      }
      if (failure_msg == (Nonnull<const_char_*>)0x0) {
        if ((this->descriptor_->options_->field_0)._impl_.map_entry_ == false) {
          b = (AlphaNum *)
              (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
          pAVar16 = (AlphaNum *)
                    (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (b != pAVar16) {
            local_260 = uVar6 + ((long)pAVar16 - (long)b >> 2);
            piVar10 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start;
            if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish != piVar10) {
              ppSVar5 = (pointer *)
                        ((long)&local_200[0].
                                super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                                ._M_impl + 0x10);
              pAVar16 = (AlphaNum *)0x0;
              do {
                if (piVar10[(long)pAVar16] < 0) {
                  local_190._0_8_ = (AlphaNum *)local_180;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"~0u","");
                }
                else {
                  pcVar11 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                                      (piVar10[(long)pAVar16],(Nonnull<char_*>)ppSVar5);
                  local_200[0].
                  super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pcVar11 + -(long)ppSVar5);
                  local_200[0].
                  super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppSVar5;
                  local_190._0_8_ = (AlphaNum *)local_180;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_190,ppSVar5,pcVar11);
                }
                Formatter::operator()
                          ((Formatter *)local_230,"$1$,\n",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_190);
                if ((AlphaNum *)local_190._0_8_ != (AlphaNum *)local_180) {
                  operator_delete((void *)local_190._0_8_,local_180._0_8_ + 1);
                }
                pAVar16 = (AlphaNum *)
                          ((long)&(((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&pAVar16->piece_)->
                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ).settings_.
                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                  .
                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                  .value.capacity_ + 1);
                piVar10 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                b = (AlphaNum *)
                    ((long)(this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2);
              } while (pAVar16 < b);
            }
          }
        }
        else {
          b = (AlphaNum *)(local_230 + 8);
          format_10._M_str = "0,\n1,\n";
          format_10._M_len = 6;
          io::Printer::
          FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                    ((Printer *)local_230._0_8_,
                     (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )ZEXT816(0),
                     (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)b,format_10);
          local_260 = uVar6 + 2;
        }
        piVar18 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        piVar4 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (piVar18 != piVar4) {
          local_260 = local_260 + ((long)piVar4 - (long)piVar18 >> 2);
          ppSVar5 = (pointer *)
                    ((long)&local_200[0].
                            super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                            ._M_impl + 0x10);
          do {
            if (*piVar18 < 0) {
              local_258._0_8_ = local_258 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"~0u,","");
            }
            else {
              pcVar11 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                                  (*piVar18,(Nonnull<char_*>)ppSVar5);
              local_200[0].
              super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)(pcVar11 + -(long)ppSVar5);
              local_190._0_8_ = &DAT_0000001a;
              local_190._8_8_ = ",  // inlined_string_index";
              local_200[0].
              super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppSVar5;
              absl::lts_20250127::StrCat_abi_cxx11_
                        ((string *)local_258,(lts_20250127 *)local_200,(AlphaNum *)local_190,b);
            }
            Formatter::operator()((Formatter *)local_230,"$1$\n",(string *)local_258);
            if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
              operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
            }
            piVar18 = piVar18 + 1;
          } while (piVar18 != piVar4);
        }
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_230 + 8));
        absl::lts_20250127::
        Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup(&local_148);
        absl::lts_20250127::
        Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup(&local_130);
        return local_260;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                 ,0xa86,failure_msg);
LAB_0025d211:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_200);
    }
    field = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                      (&local_158);
    if ((field->options_->field_0)._impl_.weak_ == false) {
      if ((field->field_0x3 & 1) != 0) {
        if ((field->field_0x1 & 0x10) == 0) {
          pOVar12 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar12 = (field->scope_).containing_oneof;
          if (pOVar12 == (OneofDescriptor *)0x0) {
            iVar13 = 0xb31;
            goto LAB_0025d23b;
          }
        }
        if (pOVar12 == (OneofDescriptor *)0x0) {
          iVar13 = 0xb63;
LAB_0025d23b:
          protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,iVar13);
        }
        if ((pOVar12->field_count_ == 1) && ((pOVar12->fields_->field_0x1 & 2) != 0)) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_200,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb64,"!res->is_synthetic()");
          goto LAB_0025d211;
        }
        if ((field->field_0x3 & 1) != 0) goto LAB_0025ccb2;
      }
      bVar8 = ShouldSplit(field,opts);
      local_160 = "";
      split = 0xd1;
      if (bVar8) {
        local_160 = "::Impl_::Split";
      }
      bVar8 = ShouldSplit(field,opts);
      if (bVar8) {
        FieldName_abi_cxx11_((string *)local_1b0,(cpp *)field,field_00);
        local_200[0].
        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1b0._8_8_;
        local_200[0].
        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b0._0_8_;
        local_190._0_8_ = (AlphaNum *)0x1;
        local_190._8_8_ = "_";
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_258,(lts_20250127 *)local_200,(AlphaNum *)local_190,
                   (AlphaNum *)local_1b0._8_8_);
      }
      else {
        FieldMemberName_abi_cxx11_
                  ((string *)local_258,(cpp *)field,(FieldDescriptor *)0x0,(bool)split);
      }
      Formatter::operator()
                ((Formatter *)local_230,"PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",
                 (char **)(local_180 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258);
      if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
      }
      if ((bVar8) && ((pointer)local_1b0._0_8_ != (pointer)(local_1b0 + 0x10))) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
    }
    else {
LAB_0025ccb2:
      format_06._M_str = "::_pbi::kInvalidFieldOffsetTag";
      format_06._M_len = 0x1e;
      io::Printer::
      FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)local_230._0_8_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),
                 (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_230 + 8),format_06);
    }
    bVar8 = ShouldSplit(field,opts);
    if (bVar8) {
      format_07._M_str = " | ::_pbi::kSplitFieldOffsetMask";
      format_07._M_len = 0x20;
      io::Printer::
      FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)local_230._0_8_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),
                 (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_230 + 8),format_07);
    }
    bVar8 = IsEagerlyVerifiedLazy(field,opts,this->scc_analyzer_);
    sVar14 = 0x14;
    pcVar15 = " | ::_pbi::kLazyMask";
    if (bVar8) {
LAB_0025cea1:
      format_08._M_str = pcVar15;
      format_08._M_len = sVar14;
      io::Printer::
      FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)local_230._0_8_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),
                 (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_230 + 8),format_08);
    }
    else {
      bVar8 = IsStringInlined(field,opts);
      sVar14 = 0x17;
      pcVar15 = " | ::_pbi::kInlinedMask";
      if (bVar8) goto LAB_0025cea1;
    }
    format_09._M_str = ",\n";
    format_09._M_len = 2;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_230._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_230 + 8),format_09);
    local_158.idx = local_158.idx + 1;
  } while( true );
}

Assistant:

size_t MessageGenerator::GenerateOffsets(io::Printer* p) {
  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  Formatter format(p);

  int num_generated_indices = 1;
  const auto make_bitmap = [&](auto... bits) {
    uint32_t res = 0;
    int index = 0;
    ((res |= (static_cast<uint32_t>(bits) << index++)), ...);
    ((num_generated_indices += bits), ...);
    return absl::StrCat("0x", absl::Hex(res, absl::kZeroPad3));
  };

  const bool has_has_bits =
      !has_bit_indices_.empty() || IsMapEntryMessage(descriptor_);
  const bool has_extensions = descriptor_->extension_range_count() > 0;
  const bool has_oneofs = descriptor_->real_oneof_decl_count() > 0;
  const bool has_weak_fields = num_weak_fields_ > 0;
  const bool has_inline_strings = !inlined_string_indices_.empty();
  const bool has_split = ShouldSplit(descriptor_, options_);

  format("$1$, // bitmap\n",
         // These conditions have to match exactly the order done below
         make_bitmap(has_has_bits, has_extensions, has_oneofs, has_weak_fields,
                     has_inline_strings, has_split, has_split, has_has_bits,
                     has_inline_strings));

  // The order of these offsets has to match the reading of them in
  // MigrationToReflectionSchema.
  if (has_has_bits) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n");
  }
  if (has_extensions) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n");
  }
  if (has_oneofs) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n");
  }
  if (has_weak_fields) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n");
  }
  if (has_inline_strings) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, "
        "$inlined_string_donated_array$),\n");
  }
  if (has_split) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\n"
        "sizeof($classtype$::Impl_::Split),\n");
  }
  const size_t offsets = num_generated_indices + descriptor_->field_count() +
                         descriptor_->real_oneof_decl_count();
  if (has_has_bits) {
    format("$1$, // hasbit index offset\n", offsets);
  }
  if (has_inline_strings) {
    format("$1$, // inline string index offset\n",
           offsets + has_bit_indices_.size());
  }
  size_t entries = offsets;
  for (auto field : FieldRange(descriptor_)) {
    // TODO: We should not have an entry in the offset table for fields
    // that do not use them.
    if (field->options().weak() || field->real_containing_oneof()) {
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      format("::_pbi::kInvalidFieldOffsetTag");
    } else {
      format("PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",
             ShouldSplit(field, options_) ? "::Impl_::Split" : "",
             ShouldSplit(field, options_)
                 ? absl::StrCat(FieldName(field), "_")
                 : FieldMemberName(field, /*split=*/false));
    }

    // Some information about a field is in the pdproto profile. The profile is
    // only available at compile time. So we embed such information in the
    // offset of the field, so that the information is available when
    // reflectively accessing the field at run time.
    //
    // We embed whether the field is cold to the MSB of the offset, and whether
    // the field is eagerly verified lazy or inlined string to the LSB of the
    // offset.

    if (ShouldSplit(field, options_)) {
      format(" | ::_pbi::kSplitFieldOffsetMask");
    }
    if (IsEagerlyVerifiedLazy(field, options_, scc_analyzer_)) {
      format(" | ::_pbi::kLazyMask");
    } else if (IsStringInlined(field, options_)) {
      format(" | ::_pbi::kInlinedMask");
    }
    format(",\n");
  }

  int count = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n", oneof->name());
    count++;
  }
  ABSL_CHECK_EQ(count, descriptor_->real_oneof_decl_count());

  if (IsMapEntryMessage(descriptor_)) {
    entries += 2;
    format(
        "0,\n"
        "1,\n");
  } else if (!has_bit_indices_.empty()) {
    entries += has_bit_indices_.size();
    for (size_t i = 0; i < has_bit_indices_.size(); ++i) {
      const std::string index =
          has_bit_indices_[i] >= 0 ? absl::StrCat(has_bit_indices_[i]) : "~0u";
      format("$1$,\n", index);
    }
  }
  if (!inlined_string_indices_.empty()) {
    entries += inlined_string_indices_.size();
    for (int inlined_string_index : inlined_string_indices_) {
      const std::string index =
          inlined_string_index >= 0
              ? absl::StrCat(inlined_string_index, ",  // inlined_string_index")
              : "~0u,";
      format("$1$\n", index);
    }
  }

  return entries;
}